

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::PolygonOffsetFactorCase::test
          (PolygonOffsetFactorCase *this)

{
  CallLogWrapper *this_00;
  GLfloat factor;
  int iVar1;
  long lVar2;
  bool bVar3;
  float fVar4;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8038);
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    factor = *(GLfloat *)((long)&DAT_0181cec0 + lVar2);
    glu::CallLogWrapper::glPolygonOffset(this_00,factor,0.0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (factor,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8038);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  iVar1 = 0x78;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    fVar4 = deRandom_getFloat(&rnd.m_rnd);
    fVar4 = fVar4 * 128000.0 + -64000.0;
    glu::CallLogWrapper::glPolygonOffset(this_00,fVar4,0.0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar4,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8038);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_FACTOR, 0.0f);
		expectError(GL_NO_ERROR);

		const float fixedTests[] =
		{
			0.0f, 0.5f, -0.5f, 1.5f
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glPolygonOffset(fixedTests[ndx], 0);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_FACTOR, fixedTests[ndx]);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(-64000, 64000);

			glPolygonOffset(reference, 0);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_FACTOR, reference);
			expectError(GL_NO_ERROR);
		}
	}